

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STTx.cpp
# Opt level: O0

void __thiscall jbcoin::STTx::STTx(STTx *this,STObject *object)

{
  bool bVar1;
  uint16_t uVar2;
  uint32_t prefix;
  Item *type;
  uint256 local_44;
  STObject *local_18;
  STObject *object_local;
  STTx *this_local;
  
  local_18 = object;
  object_local = &this->super_STObject;
  STObject::STObject(&this->super_STObject,object);
  CountedObject<jbcoin::STTx>::CountedObject((CountedObject<jbcoin::STTx> *)this);
  (this->super_STObject).super_STBase._vptr_STBase = (_func_int **)&PTR__STTx_0051a1b8;
  base_uint<256UL,_void>::base_uint(&this->tid_);
  uVar2 = STObject::getFieldU16(&this->super_STObject,(SField *)sfTransactionType);
  this->tx_type_ = (uint)uVar2;
  type = getTxFormat(this->tx_type_);
  bVar1 = STObject::setType(&this->super_STObject,&type->elements);
  if (!bVar1) {
    Throw<std::runtime_error,char_const(&)[22]>((char (*) [22])"transaction not valid");
  }
  prefix = HashPrefix::operator_cast_to_unsigned_int((HashPrefix *)&HashPrefix::transactionID);
  STObject::getHash(&local_44,&this->super_STObject,prefix);
  base_uint<256UL,_void>::operator=(&this->tid_,&local_44);
  return;
}

Assistant:

STTx::STTx (STObject&& object)
    : STObject (std::move (object))
{
    tx_type_ = static_cast <TxType> (getFieldU16 (sfTransactionType));

    if (!setType (getTxFormat (tx_type_)->elements))
        Throw<std::runtime_error> ("transaction not valid");

    tid_ = getHash(HashPrefix::transactionID);
}